

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QSpanCollection::updateRemovedRows(QSpanCollection *this,int start,int end)

{
  bool bVar1;
  int iVar2;
  iterator __position;
  const_iterator this_00;
  iterator it_00;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  int iVar8;
  int iVar9;
  SubIndex *this_01;
  iterator it;
  Index *this_02;
  long in_FS_OFFSET;
  int local_64;
  Span *span_2;
  Span *span;
  _List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __position._M_node =
       (this->spans).
       super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  if ((QSpanCollection *)__position._M_node != this) {
    local_50._M_impl._M_node._M_size = 0;
    iVar2 = (end - start) + 1;
    local_50._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_50;
    local_50._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_50;
    while ((QSpanCollection *)__position._M_node != this) {
      span = (Span *)__position._M_node[1]._M_next;
      iVar8 = span->m_bottom;
      if (iVar8 < start) {
LAB_0052760f:
        __position._M_node = (__position._M_node)->_M_next;
      }
      else {
        iVar9 = span->m_top;
        if (iVar9 < start) {
          if (end < iVar8) {
            span->m_bottom = iVar8 - iVar2;
            iVar8 = iVar8 - iVar2;
          }
          else {
            span->m_bottom = start + -1;
            iVar8 = start + -1;
          }
        }
        else if (end < iVar8) {
          bVar1 = iVar9 <= end;
          iVar9 = iVar9 - iVar2;
          if (bVar1) {
            iVar9 = start;
          }
          span->m_top = iVar9;
          iVar8 = iVar8 - iVar2;
          span->m_bottom = iVar8;
        }
        else {
          span->will_be_deleted = true;
        }
        if ((iVar9 == iVar8) && (span->m_left == span->m_right)) {
          span->will_be_deleted = true;
        }
        if (span->will_be_deleted != true) goto LAB_0052760f;
        std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
        push_back((list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)
                  &local_50,&span);
        __position = std::__cxx11::
                     list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::erase
                               (&this->spans,__position._M_node);
      }
    }
    if ((QSpanCollection *)
        (this->spans).
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next == this) {
      qDeleteAll<std::__cxx11::list<QSpanCollection::Span*,std::allocator<QSpanCollection::Span*>>>
                ((list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)
                 &local_50);
      QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::clear(&this->index);
    }
    else {
      this_02 = &this->index;
      this_00._M_node = (_Base_ptr)QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::end(this_02);
      do {
        it_00._M_node = (_Base_ptr)std::_Rb_tree_decrement(this_00._M_node);
        iVar8 = -*(int *)((long)it_00._M_node + 0x20);
        this_01 = (SubIndex *)((long)it_00._M_node + 0x28);
        if (iVar8 < start) {
          bVar1 = cleanSpanSubIndex((QSpanCollection *)this_00._M_node,this_01,iVar8,false);
          if (bVar1) {
LAB_00527882:
            it_00._M_node =
                 (_Base_ptr)
                 QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::erase
                           (this_02,(const_iterator)it_00._M_node);
          }
        }
        else {
          if (end < iVar8) {
            iVar9 = *(int *)((long)it_00._M_node + 0x20) + iVar2;
            if (end + 1 == iVar8) {
              span = (Span *)CONCAT44(span._4_4_,iVar9);
              iVar3._M_node =
                   (_Base_ptr)
                   QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::find(this_02,(int *)&span);
              iVar4._M_node =
                   (_Base_ptr)QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::end(this_02);
              if (iVar3._M_node == iVar4._M_node) {
                span_2 = (Span *)CONCAT44(span_2._4_4_,iVar9);
                span = (Span *)0x0;
                iVar3._M_node =
                     (_Base_ptr)
                     QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::insert
                               (this_02,(int *)&span_2,(QMap<int,_QSpanCollection::Span_*> *)&span);
                QtPrivate::
                QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
                ::~QExplicitlySharedDataPointerV2
                          ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
                            *)&span);
              }
              iVar5._M_node = (_Base_ptr)QMap<int,_QSpanCollection::Span_*>::begin(this_01);
              for (; iVar6 = QMap<int,_QSpanCollection::Span_*>::end(this_01),
                  (iterator)iVar5._M_node != iVar6.i._M_node;
                  iVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar5._M_node)) {
                span = (Span *)iVar5._M_node[1]._M_parent;
                if (*(char *)&((_Base_ptr)span)->_M_left == '\0') {
                  QMap<int,_QSpanCollection::Span_*>::insert
                            ((QMap<int,_QSpanCollection::Span_*> *)&iVar3._M_node[1]._M_parent,
                             (int *)(iVar5._M_node + 1),&span);
                }
              }
            }
            else {
              span = (Span *)CONCAT44(span._4_4_,iVar9);
              QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::insert(this_02,(int *)&span,this_01);
            }
            goto LAB_00527882;
          }
          span = (Span *)0x0;
          iVar5._M_node = (_Base_ptr)QMap<int,_QSpanCollection::Span_*>::begin(this_01);
          bVar1 = false;
          for (; iVar6 = QMap<int,_QSpanCollection::Span_*>::end(this_01),
              (iterator)iVar5._M_node != iVar6.i._M_node;
              iVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar5._M_node)) {
            span_2 = (Span *)iVar5._M_node[1]._M_parent;
            if (*(char *)&((_Base_ptr)span_2)->_M_left == '\0') {
              if ((!bVar1) && (((_Base_ptr)span_2)->_M_color == start)) {
                bVar1 = true;
              }
              QMap<int,_QSpanCollection::Span_*>::insert
                        ((QMap<int,_QSpanCollection::Span_*> *)&span,(int *)(iVar5._M_node + 1),
                         &span_2);
            }
          }
          if ((iVar8 == start) && (bVar1)) {
            QMap<int,_QSpanCollection::Span_*>::clear(this_01);
            iVar3._M_node = it_00._M_node;
LAB_00527834:
            for (iVar5._M_node =
                      (_Base_ptr)
                      QMap<int,_QSpanCollection::Span_*>::begin
                                ((QMap<int,_QSpanCollection::Span_*> *)&span);
                iVar6 = QMap<int,_QSpanCollection::Span_*>::end
                                  ((QMap<int,_QSpanCollection::Span_*> *)&span),
                (iterator)iVar5._M_node != iVar6.i._M_node;
                iVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar5._M_node)) {
              QMap<int,_QSpanCollection::Span_*>::insert
                        ((QMap<int,_QSpanCollection::Span_*> *)&it_00._M_node[1]._M_parent,
                         (int *)(iVar5._M_node + 1),(Span **)&iVar5._M_node[1]._M_parent);
            }
          }
          else {
            iVar3._M_node =
                 (_Base_ptr)
                 QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::erase
                           (this_02,(const_iterator)it_00._M_node);
            if ((iVar8 != start) && (bVar1)) {
              span_2 = (Span *)CONCAT44(span_2._4_4_,-start);
              it_00._M_node =
                   (_Base_ptr)
                   QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::find(this_02,(int *)&span_2);
              iVar4._M_node =
                   (_Base_ptr)QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::end(this_02);
              if (it_00._M_node == iVar4._M_node) {
                span_2 = (Span *)0x0;
                local_64 = -start;
                it_00._M_node =
                     (_Base_ptr)
                     QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::insert
                               (this_02,&local_64,(QMap<int,_QSpanCollection::Span_*> *)&span_2);
                QtPrivate::
                QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
                ::~QExplicitlySharedDataPointerV2
                          ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
                            *)&span_2);
              }
              goto LAB_00527834;
            }
          }
          QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
          ::~QExplicitlySharedDataPointerV2
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
                      *)&span);
          it_00._M_node = iVar3._M_node;
        }
        iVar7 = QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::begin(this_02);
        this_00._M_node = it_00._M_node;
      } while ((iterator)it_00._M_node != iVar7.i._M_node);
      qDeleteAll<std::__cxx11::list<QSpanCollection::Span*,std::allocator<QSpanCollection::Span*>>>
                ((list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)
                 &local_50);
    }
    std::__cxx11::_List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
    _M_clear(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSpanCollection::updateRemovedRows(int start, int end)
{
#ifdef DEBUG_SPAN_UPDATE
    qDebug() << start << end << Qt::endl << index;
#endif
    if (spans.empty())
        return;

    SpanList spansToBeDeleted;
    int delta = end - start + 1;
#ifdef DEBUG_SPAN_UPDATE
    qDebug("Before");
#endif
    for (SpanList::iterator it = spans.begin(); it != spans.end(); ) {
        Span *span = *it;
#ifdef DEBUG_SPAN_UPDATE
        qDebug() << span << *span;
#endif
        if (span->m_bottom < start) {
            ++it;
            continue;
        }
        if (span->m_top < start) {
            if (span->m_bottom <= end)
                span->m_bottom = start - 1;
            else
                span->m_bottom -= delta;
        } else {
            if (span->m_bottom > end) {
                if (span->m_top <= end)
                    span->m_top = start;
                else
                    span->m_top -= delta;
                span->m_bottom -= delta;
            } else {
                span->will_be_deleted = true;
            }
        }
        if (span->m_top == span->m_bottom && span->m_left == span->m_right)
            span->will_be_deleted = true;
        if (span->will_be_deleted) {
            spansToBeDeleted.push_back(span);
            it = spans.erase(it);
        } else {
            ++it;
        }
    }

#ifdef DEBUG_SPAN_UPDATE
    qDebug("After");
    qDebug() << spans;
#endif
    if (spans.empty()) {
        qDeleteAll(spansToBeDeleted);
        index.clear();
        return;
    }

    Index::iterator it_y = index.end();
    do {
        --it_y;
        int y = -it_y.key();
        SubIndex &subindex = it_y.value();
        if (y < start) {
            if (cleanSpanSubIndex(subindex, y))
                it_y = index.erase(it_y);
        } else if (y >= start && y <= end) {
            bool span_at_start = false;
            SubIndex spansToBeMoved;
            for (SubIndex::iterator it = subindex.begin(); it != subindex.end(); ++it) {
                Span *span = it.value();
                if (span->will_be_deleted)
                    continue;
                if (!span_at_start && span->m_top == start)
                    span_at_start = true;
                spansToBeMoved.insert(it.key(), span);
            }

            if (y == start && span_at_start)
                subindex.clear();
            else
                it_y = index.erase(it_y);

            if (span_at_start) {
                Index::iterator it_start;
                if (y == start)
                    it_start = it_y;
                else {
                    it_start = index.find(-start);
                    if (it_start == index.end())
                        it_start = index.insert(-start, SubIndex());
                }
                SubIndex &start_subindex = it_start.value();
                for (SubIndex::iterator it = spansToBeMoved.begin(); it != spansToBeMoved.end(); ++it)
                    start_subindex.insert(it.key(), it.value());
            }
        } else {
            if (y == end + 1) {
                Index::iterator it_top = index.find(-y + delta);
                if (it_top == index.end())
                    it_top = index.insert(-y + delta, SubIndex());
                for (SubIndex::iterator it = subindex.begin(); it != subindex.end(); ) {
                    Span *span = it.value();
                    if (!span->will_be_deleted)
                        it_top.value().insert(it.key(), span);
                    ++it;
                }
            } else {
                index.insert(-y + delta, subindex);
            }
            it_y = index.erase(it_y);
        }
    } while (it_y != index.begin());

#ifdef DEBUG_SPAN_UPDATE
    qDebug() << index;
    qDebug("Deleted");
    qDebug() << spansToBeDeleted;
#endif
    qDeleteAll(spansToBeDeleted);
}